

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintSExpression::visitLoop(PrintSExpression *this,Loop *curr)

{
  ostream *this_00;
  char *in_RCX;
  Name name;
  char local_1a [2];
  
  this->controlFlowDepth = this->controlFlowDepth + 1;
  local_1a[1] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,local_1a + 1,1);
  printExpressionContents(this,(Expression *)curr);
  incIndent(this);
  maybePrintImplicitBlock(this,curr->body);
  decIndent(this);
  if (this->full == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o," ;; end loop",0xc);
    if ((curr->name).super_IString.str._M_str != (char *)0x0) {
      local_1a[0] = ' ';
      this_00 = std::__ostream_insert<char,std::char_traits<char>>(this->o,local_1a,1);
      name.super_IString.str._M_str = in_RCX;
      name.super_IString.str._M_len = (size_t)(curr->name).super_IString.str._M_str;
      wasm::operator<<((wasm *)this_00,(ostream *)(curr->name).super_IString.str._M_len,name);
    }
  }
  this->controlFlowDepth = this->controlFlowDepth + -1;
  return;
}

Assistant:

void PrintSExpression::visitLoop(Loop* curr) {
  controlFlowDepth++;
  o << '(';
  printExpressionContents(curr);
  incIndent();
  maybePrintImplicitBlock(curr->body);
  decIndent();
  if (full) {
    o << " ;; end loop";
    if (curr->name.is()) {
      o << ' ' << curr->name;
    }
  }
  controlFlowDepth--;
}